

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
anon_unknown.dwarf_21daf9::ScriptMaker::ToPKBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ScriptMaker *this,uint32_t key)

{
  pointer pCVar1;
  bool bVar2;
  byte bVar3;
  allocator_type *__a;
  long lVar4;
  uchar *__last;
  pointer this_00;
  long in_FS_OFFSET;
  allocator_type local_41;
  XOnlyPubKey xonly_pubkey;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = miniscript::IsTapscript(this->m_script_ctx);
  if (bVar2) {
    this_00 = (pointer)&xonly_pubkey;
    XOnlyPubKey::XOnlyPubKey
              ((XOnlyPubKey *)this_00,
               (this->m_keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
               super__Vector_impl_data._M_start + key);
    __last = (uchar *)&local_20;
    __a = &local_41;
  }
  else {
    pCVar1 = (this->m_keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
             super__Vector_impl_data._M_start;
    this_00 = pCVar1 + key;
    bVar3 = pCVar1[key].vch[0];
    if ((bVar3 & 0xfe) == 2) {
      lVar4 = 0x21;
    }
    else {
      bVar3 = bVar3 - 4;
      if (bVar3 < 4) {
        lVar4 = *(long *)(&DAT_00222988 + (ulong)bVar3 * 8);
      }
      else {
        lVar4 = 0;
      }
    }
    __last = (((uint256 *)this_00->vch)->super_base_blob<256U>).m_data._M_elems + lVar4;
    __a = (allocator_type *)&xonly_pubkey;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             this_00->vch,__last,__a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> ToPKBytes(uint32_t key) const {
        // In Tapscript keys always serialize as x-only, whether an x-only key was used in the descriptor or not.
        if (!miniscript::IsTapscript(m_script_ctx)) {
            return {m_keys[key].begin(), m_keys[key].end()};
        }
        const XOnlyPubKey xonly_pubkey{m_keys[key]};
        return {xonly_pubkey.begin(), xonly_pubkey.end()};
    }